

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O2

void mpickgold(monst *mtmp)

{
  ushort uVar1;
  char cVar2;
  obj *obj;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  
  obj = gold_at(level,(int)mtmp->mx,(int)mtmp->my);
  if (obj != (obj *)0x0) {
    uVar1 = *(ushort *)&objects[obj->otyp].field_0x11;
    obj_extract_self(obj);
    add_to_minv(mtmp,obj);
    cVar2 = mtmp->my;
    cVar4 = mtmp->mx;
    if ((viz_array[cVar2][cVar4] & 2U) != 0) {
      if ((flags.verbose != '\0') && ((mtmp->field_0x63 & 8) == 0)) {
        pcVar3 = Monnam(mtmp);
        pcVar5 = "money";
        if ((uVar1 & 0x1f0) == 0xf0) {
          pcVar5 = "gold";
        }
        pline("%s picks up some %s.",pcVar3,pcVar5);
        cVar4 = mtmp->mx;
        cVar2 = mtmp->my;
      }
      newsym((int)cVar4,(int)cVar2);
      return;
    }
  }
  return;
}

Assistant:

void mpickgold(struct monst *mtmp)
{
    struct obj *gold;
    int mat_idx;

    if ((gold = gold_at(level, mtmp->mx, mtmp->my)) != 0) {
	mat_idx = objects[gold->otyp].oc_material;
        obj_extract_self(gold);
        add_to_minv(mtmp, gold);
	if (cansee(mtmp->mx, mtmp->my) ) {
	    if (flags.verbose && !mtmp->isgd)
		pline("%s picks up some %s.", Monnam(mtmp),
			mat_idx == GOLD ? "gold" : "money");
	    newsym(mtmp->mx, mtmp->my);
	}
    }
}